

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

void __thiscall
license::Project::Project
          (Project *this,string *name,string *project_folder,string *source_folder,
          bool force_overwrite)

{
  bool bVar1;
  string *psVar2;
  long lVar3;
  invalid_argument *this_00;
  runtime_error *prVar4;
  char cVar5;
  allocator local_131;
  path template_fname2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  path templates_path;
  path template_fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_project_folder,(string *)project_folder);
  std::__cxx11::string::string((string *)&templates_path,(string *)source_folder);
  bVar1 = boost::filesystem::exists(&templates_path);
  if (!bVar1) {
LAB_00180f82:
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_110,"Templates directory [",(allocator *)&local_b0);
    std::operator+(&template_fname2.m_pathname,&local_110,&templates_path.m_pathname);
    std::operator+(&template_fname.m_pathname,&template_fname2.m_pathname,
                   "] does not exist or is not a directory");
    std::runtime_error::runtime_error(prVar4,(string *)&template_fname);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = boost::filesystem::is_directory(&templates_path);
  if (!bVar1) goto LAB_00180f82;
  boost::filesystem::path::path(&template_fname2,"public_key.inja");
  boost::filesystem::operator/(&template_fname,&templates_path,&template_fname2);
  std::__cxx11::string::~string((string *)&template_fname2);
  bVar1 = boost::filesystem::exists(&template_fname);
  if (bVar1) {
    bVar1 = boost::filesystem::is_regular_file(&template_fname);
    if (bVar1) goto LAB_00180eaa;
  }
  boost::filesystem::path::path((path *)&local_110,"templates");
  boost::filesystem::operator/(&template_fname2,&templates_path,(path *)&local_110);
  std::__cxx11::string::operator=((string *)&templates_path,(string *)&template_fname2);
  std::__cxx11::string::~string((string *)&template_fname2);
  std::__cxx11::string::~string((string *)&local_110);
  boost::filesystem::path::path((path *)&local_110,"public_key.inja");
  boost::filesystem::operator/(&template_fname2,&templates_path,(path *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  bVar1 = boost::filesystem::exists(&template_fname2);
  if (bVar1) {
    bVar1 = boost::filesystem::is_regular_file(&template_fname2);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&template_fname2);
LAB_00180eaa:
      psVar2 = (string *)boost::filesystem::path::normalize(&templates_path);
      std::__cxx11::string::string((string *)&template_fname2,psVar2);
      std::__cxx11::string::string((string *)&this->m_templates_folder,(string *)&template_fname2);
      std::__cxx11::string::~string((string *)&template_fname2);
      std::__cxx11::string::~string((string *)&template_fname);
      std::__cxx11::string::~string((string *)&templates_path);
      this->m_force_overwrite = force_overwrite;
      cVar5 = (char)name;
      lVar3 = std::__cxx11::string::find(cVar5,0x5b);
      if (lVar3 == -1) {
        lVar3 = std::__cxx11::string::find(cVar5,0x5d);
        if (lVar3 == -1) {
          lVar3 = std::__cxx11::string::find(cVar5,0x2f);
          if (lVar3 == -1) {
            lVar3 = std::__cxx11::string::find(cVar5,0x5c);
            if (lVar3 == -1) {
              return;
            }
          }
        }
      }
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"project name should not contain any of \'[ ] / \' characters.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_90,"Templates file [",&local_131);
  std::operator+(&local_70,&local_90,&template_fname2.m_pathname);
  std::operator+(&local_50,&local_70,"] does not exist. tried also [");
  std::operator+(&local_b0,&local_50,&template_fname.m_pathname);
  std::operator+(&local_110,&local_b0,"]");
  std::runtime_error::runtime_error(prVar4,(string *)&local_110);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Project::Project(const std::string &name, const std::string &project_folder, const std::string &source_folder,
				 bool force_overwrite)
	: m_name(name),
	  m_project_folder(project_folder),
	  m_templates_folder(guess_templates_folder(source_folder)),
	  m_force_overwrite(force_overwrite) {
	if (name.find('[') != std::string::npos || name.find(']') != std::string::npos ||
		name.find('/') != std::string::npos || name.find('\\') != std::string::npos) {
		throw invalid_argument("project name should not contain any of '[ ] / \' characters.");
	}
}